

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O3

void __thiscall edk2_vss_t::vss_variable_t::_read(vss_variable_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  edk2_vss_t *peVar2;
  vss_variable_attributes_t *pvVar3;
  kstream *pkVar4;
  pointer pcVar5;
  uint8_t uVar6;
  bool bVar7;
  uint32_t uVar8;
  int iVar9;
  vss_variable_attributes_t *this_00;
  validation_expr_error<unsigned_int> *pvVar10;
  validation_expr_error<unsigned_char> *this_01;
  validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar11;
  uint uVar12;
  string _;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar6 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar6;
  this->n_signature_last = true;
  if (uVar6 == 0xaa) {
    this->n_signature_last = false;
    uVar6 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar6;
    if (uVar6 != 'U') {
      this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      local_130._M_dataplus._M_p._0_1_ = this->m_signature_last;
      pkVar4 = (this->super_kstruct).m__io;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"/types/vss_variable/seq/1","");
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_01,(uchar *)&local_130,pkVar4,&local_50);
      __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    this->n_state = true;
    if (this->m_signature_first == 0xaa) {
      this->n_state = false;
      uVar6 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_state = uVar6;
      this->n_reserved = true;
      if (this->m_signature_first != 0xaa) goto LAB_00142eec;
      this->n_reserved = false;
      uVar6 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
      this->m_reserved = uVar6;
      this->n_attributes = true;
      if (this->m_signature_first != 0xaa) goto LAB_00142f60;
      this->n_attributes = false;
      this_00 = (vss_variable_attributes_t *)operator_new(0x38);
      peVar2 = this->m__root;
      (this_00->super_kstruct).m__io = (this->super_kstruct).m__io;
      (this_00->super_kstruct)._vptr_kstruct =
           (_func_int **)&PTR__vss_variable_attributes_t_00184c40;
      this_00->m__parent = this;
      this_00->m__root = peVar2;
      vss_variable_attributes_t::_read(this_00);
      pvVar3 = (this->m_attributes)._M_t.
               super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
               .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl;
      (this->m_attributes)._M_t.
      super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
      .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl = this_00;
      if (pvVar3 != (vss_variable_attributes_t *)0x0) {
        (**(code **)((long)(pvVar3->super_kstruct)._vptr_kstruct + 8))();
      }
      goto LAB_00142ef0;
    }
    this->n_reserved = true;
    this->n_attributes = true;
LAB_00142f60:
    this->n_len_total = true;
    this->n_len_name = true;
LAB_00142ff1:
    this->n_len_data = true;
    this->n_timestamp = true;
LAB_00142ff9:
    this->n_pubkey_index = true;
LAB_00142ffd:
    this->n_len_name_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar7 = is_auth(this);
      if (bVar7) {
        this->n_len_name_auth = false;
        uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_len_name_auth = uVar8;
        if ((uVar8 < 4) || (iVar9 = kaitai::kstream::mod(uVar8,2), iVar9 != 0)) {
          pvVar10 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
          local_130._M_dataplus._M_p._0_4_ = this->m_len_name_auth;
          pkVar4 = (this->super_kstruct).m__io;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"/types/vss_variable/seq/10","");
          kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                    (pvVar10,(uint *)&local_130,pkVar4,&local_90);
          __cxa_throw(pvVar10,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                      kaitai::kstruct_error::~kstruct_error);
        }
      }
      goto LAB_0014304b;
    }
    this->n_len_data_auth = true;
LAB_0014310c:
    this->n_vendor_guid = true;
    if (this->m_signature_first == 0xaa) {
      this->n_vendor_guid = false;
      kaitai::kstream::read_bytes_abi_cxx11_(&local_130,(this->super_kstruct).m__io,0x10);
      std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      this->n_name_auth = true;
      if (this->m_signature_first != 0xaa) goto LAB_00143226;
      bVar7 = is_auth(this);
      if (bVar7) {
        this->n_name_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&local_130,(this->super_kstruct).m__io,(ulong)this->m_len_name_auth);
        std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
    }
    else {
      this->n_name_auth = true;
    }
    this->n_data_auth = true;
    if (this->m_signature_first == 0xaa) {
      bVar7 = is_auth(this);
      if (bVar7) {
        this->n_data_auth = false;
        kaitai::kstream::read_bytes_abi_cxx11_
                  (&local_130,(this->super_kstruct).m__io,(ulong)this->m_len_data_auth);
        std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      goto LAB_0014322d;
    }
    this->n_apple_data_crc32 = true;
    goto LAB_001432a9;
  }
  this->n_state = true;
  this->n_reserved = true;
LAB_00142eec:
  this->n_attributes = true;
LAB_00142ef0:
  this->n_len_total = true;
  if (this->m_signature_first == 0xaa) {
    if (this->f_is_intel_legacy == true) {
      if (this->m_is_intel_legacy == false) goto LAB_00142f07;
LAB_00142f7e:
      this->n_len_total = false;
      uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_total = uVar8;
      if (this->f_len_intel_legacy_header == true) {
        uVar12 = (int)this->m_len_intel_legacy_header + 5;
      }
      else {
        this->f_len_intel_legacy_header = true;
        this->m_len_intel_legacy_header = '\x1c';
        uVar12 = 0x21;
      }
      if (uVar8 < uVar12) {
        pvVar10 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
        local_130._M_dataplus._M_p._0_4_ = this->m_len_total;
        pkVar4 = (this->super_kstruct).m__io;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"/types/vss_variable/seq/5","");
        kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                  (pvVar10,(uint *)&local_130,pkVar4,&local_70);
        __cxa_throw(pvVar10,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                    kaitai::kstruct_error::~kstruct_error);
      }
      this->n_len_name = true;
      if (this->m_signature_first != 0xaa) goto LAB_00142ff1;
    }
    else {
      bVar7 = (this->m_state & 0xfb) == 0xf8;
      this->m_is_intel_legacy = bVar7;
      this->f_is_intel_legacy = true;
      if (bVar7) goto LAB_00142f7e;
LAB_00142f07:
      this->n_len_name = true;
    }
    if (this->f_is_intel_legacy == true) {
      if (this->m_is_intel_legacy == false) goto LAB_00142fce;
LAB_001433e2:
      this->n_len_data = true;
    }
    else {
      bVar7 = (this->m_state & 0xfb) == 0xf8;
      this->m_is_intel_legacy = bVar7;
      this->f_is_intel_legacy = true;
      if (bVar7) goto LAB_001433e2;
LAB_00142fce:
      this->n_len_name = false;
      uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_name = uVar8;
      this->n_len_data = true;
      if (this->m_signature_first != 0xaa) goto LAB_00142f18;
    }
    if (this->f_is_intel_legacy == true) {
      if (this->m_is_intel_legacy == false) goto LAB_001433f2;
LAB_00143423:
      this->n_timestamp = true;
    }
    else {
      bVar7 = (this->m_state & 0xfb) == 0xf8;
      this->m_is_intel_legacy = bVar7;
      this->f_is_intel_legacy = true;
      if (bVar7) goto LAB_00143423;
LAB_001433f2:
      this->n_len_data = false;
      uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_data = uVar8;
      this->n_timestamp = true;
      if (this->m_signature_first != 0xaa) goto LAB_00142ff9;
    }
    bVar7 = is_auth(this);
    if (bVar7) {
      this->n_timestamp = false;
      kaitai::kstream::read_bytes_abi_cxx11_(&local_130,(this->super_kstruct).m__io,0x10);
      std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
  }
  else {
    this->n_len_name = true;
    this->n_len_data = true;
LAB_00142f18:
    this->n_timestamp = true;
  }
  this->n_pubkey_index = true;
  if (this->m_signature_first == 0xaa) {
    bVar7 = is_auth(this);
    if (bVar7) {
      this->n_pubkey_index = false;
      uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_pubkey_index = uVar8;
    }
    goto LAB_00142ffd;
  }
  this->n_len_name_auth = true;
LAB_0014304b:
  this->n_len_data_auth = true;
  if (this->m_signature_first == 0xaa) {
    bVar7 = is_auth(this);
    if (bVar7) {
      this->n_len_data_auth = false;
      uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_len_data_auth = uVar8;
      if (uVar8 == 0) {
        pvVar10 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
        local_130._M_dataplus._M_p._0_4_ = this->m_len_data_auth;
        pkVar4 = (this->super_kstruct).m__io;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"/types/vss_variable/seq/11","");
        kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                  (pvVar10,(uint *)&local_130,pkVar4,&local_b0);
        __cxa_throw(pvVar10,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                    kaitai::kstruct_error::~kstruct_error);
      }
    }
    goto LAB_0014310c;
  }
  this->n_vendor_guid = true;
  this->n_name_auth = true;
LAB_00143226:
  this->n_data_auth = true;
LAB_0014322d:
  this->n_apple_data_crc32 = true;
  if (this->m_signature_first != 0xaa) {
    this->n_intel_legacy_data = true;
    this->n_name = true;
    goto LAB_00143257;
  }
  if (this->f_is_intel_legacy == true) {
    if (this->m_is_intel_legacy == false) {
LAB_0014327d:
      bVar7 = is_auth(this);
      if ((!bVar7) &&
         (((this->m_attributes)._M_t.
           super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
           .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl)->
          m_apple_data_checksum == true)) {
        this->n_apple_data_crc32 = false;
        uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
        this->m_apple_data_crc32 = uVar8;
      }
    }
  }
  else {
    bVar7 = (this->m_state & 0xfb) == 0xf8;
    this->m_is_intel_legacy = bVar7;
    this->f_is_intel_legacy = true;
    if (!bVar7) goto LAB_0014327d;
  }
LAB_001432a9:
  this->n_intel_legacy_data = true;
  if (this->m_signature_first != 0xaa) {
    this->n_name = true;
    goto LAB_001432d6;
  }
  if (this->f_is_intel_legacy == true) {
    if (this->m_is_intel_legacy == false) goto LAB_001432c3;
LAB_0014330a:
    this->n_intel_legacy_data = false;
    pkVar4 = (this->super_kstruct).m__io;
    if (this->f_len_intel_legacy_header == true) {
      iVar9 = (int)this->m_len_intel_legacy_header;
    }
    else {
      this->f_len_intel_legacy_header = true;
      this->m_len_intel_legacy_header = '\x1c';
      iVar9 = 0x1c;
    }
    kaitai::kstream::read_bytes_abi_cxx11_(&local_130,pkVar4,(ulong)(this->m_len_total - iVar9));
    std::__cxx11::string::operator=((string *)&this->m_intel_legacy_data,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    this->n_name = true;
    if (this->m_signature_first != 0xaa) {
LAB_00143257:
      this->n_data = true;
      return;
    }
  }
  else {
    bVar7 = (this->m_state & 0xfb) == 0xf8;
    this->m_is_intel_legacy = bVar7;
    this->f_is_intel_legacy = true;
    if (bVar7) goto LAB_0014330a;
LAB_001432c3:
    this->n_name = true;
  }
  if (this->f_is_intel_legacy == true) {
    if (this->m_is_intel_legacy != false) goto LAB_001432d6;
  }
  else {
    bVar7 = (this->m_state & 0xfb) == 0xf8;
    this->m_is_intel_legacy = bVar7;
    this->f_is_intel_legacy = true;
    if (bVar7) goto LAB_001432d6;
  }
  bVar7 = is_auth(this);
  if (!bVar7) {
    this->n_name = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_130,(this->super_kstruct).m__io,(ulong)this->m_len_name);
    std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_130);
    paVar1 = &local_130.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    pcVar5 = (this->m_name)._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar5,pcVar5 + (this->m_name)._M_string_length);
    if ((this->m_len_name < 4) || (iVar9 = kaitai::kstream::mod(this->m_len_name,2), iVar9 != 0)) {
      pvVar11 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__cxa_allocate_exception(0x40);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar5 = (this->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar5,pcVar5 + (this->m_name)._M_string_length);
      pkVar4 = (this->super_kstruct).m__io;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"/types/vss_variable/seq/17","");
      kaitai::
      validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::validation_expr_error(pvVar11,&local_110,pkVar4,&local_d0);
      __cxa_throw(pvVar11,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                  kaitai::kstruct_error::~kstruct_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
LAB_001432d6:
  this->n_data = true;
  if (this->m_signature_first == 0xaa) {
    if (this->f_is_intel_legacy == true) {
      if (this->m_is_intel_legacy != false) {
        return;
      }
    }
    else {
      bVar7 = (this->m_state & 0xfb) == 0xf8;
      this->m_is_intel_legacy = bVar7;
      this->f_is_intel_legacy = true;
      if (bVar7) {
        return;
      }
    }
    bVar7 = is_auth(this);
    if (!bVar7) {
      this->n_data = false;
      kaitai::kstream::read_bytes_abi_cxx11_
                (&local_130,(this->super_kstruct).m__io,(ulong)this->m_len_data);
      std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_130);
      paVar1 = &local_130.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      pcVar5 = (this->m_data)._M_dataplus._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar5,pcVar5 + (this->m_data)._M_string_length);
      if (this->m_len_name == 0) {
        pvVar11 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)__cxa_allocate_exception(0x40);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar5 = (this->m_data)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar5,pcVar5 + (this->m_data)._M_string_length);
        pkVar4 = (this->super_kstruct).m__io;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"/types/vss_variable/seq/18","");
        kaitai::
        validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::validation_expr_error(pvVar11,&local_110,pkVar4,&local_f0);
        __cxa_throw(pvVar11,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                    kaitai::kstruct_error::~kstruct_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void edk2_vss_t::vss_variable_t::_read() {
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss_variable/seq/1"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss_variable_attributes_t>(new vss_variable_attributes_t(m__io, this, m__root));
    }
    n_len_total = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_len_total = false;
        m_len_total = m__io->read_u4le();
        {
            uint32_t _ = len_total();
            if (!(_ >= ((static_cast<uint32_t>(len_intel_legacy_header()) + 4) + 1))) {
                throw kaitai::validation_expr_error<uint32_t>(len_total(), _io(), std::string("/types/vss_variable/seq/5"));
            }
        }
    }
    n_len_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
        {
            uint32_t _ = len_name_auth();
            if (!( ((_ >= 4) && (kaitai::kstream::mod(_, 2) == 0)) )) {
                throw kaitai::validation_expr_error<uint32_t>(len_name_auth(), _io(), std::string("/types/vss_variable/seq/10"));
            }
        }
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
        {
            uint32_t _ = len_data_auth();
            if (!(_ > 0)) {
                throw kaitai::validation_expr_error<uint32_t>(len_data_auth(), _io(), std::string("/types/vss_variable/seq/11"));
            }
        }
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_apple_data_crc32 = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth())) && (attributes()->apple_data_checksum())) ) {
        n_apple_data_crc32 = false;
        m_apple_data_crc32 = m__io->read_u4le();
    }
    n_intel_legacy_data = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_intel_legacy_data = false;
        m_intel_legacy_data = m__io->read_bytes((len_total() - len_intel_legacy_header()));
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
        {
            std::string _ = name();
            if (!( ((len_name() >= 4) && (kaitai::kstream::mod(len_name(), 2) == 0)) )) {
                throw kaitai::validation_expr_error<std::string>(name(), _io(), std::string("/types/vss_variable/seq/17"));
            }
        }
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
        {
            std::string _ = data();
            if (!(len_name() > 0)) {
                throw kaitai::validation_expr_error<std::string>(data(), _io(), std::string("/types/vss_variable/seq/18"));
            }
        }
    }
}